

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  path *ppVar4;
  iterator iter;
  const_iterator local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  iterator local_60;
  
  bVar2 = has_relative_path(this);
  if (bVar2) {
    local_80._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    iterator::iterator(&local_60,this,&local_80);
    local_60._iter = iterator::decrement(&local_60,&local_60._iter);
    iterator::updateCurrent(&local_60);
    ppVar4 = &local_60._current;
    lVar3 = std::__cxx11::string::rfind((char)ppVar4,0x2e);
    if (1 < lVar3 + 1U) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)ppVar4);
      paVar1 = &(__return_storage_ptr__->_path).field_2;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      if (local_80._M_current == &local_70) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
        *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) = uStack_68;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_80._M_current;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70)
        ;
      }
      (__return_storage_ptr__->_path)._M_string_length = local_78;
      local_78 = 0;
      local_70 = '\0';
      local_80._M_current = &local_70;
      postprocess_path_with_format(__return_storage_ptr__,(format)ppVar4);
      if (local_80._M_current != &local_70) {
        operator_delete(local_80._M_current,CONCAT71(uStack_6f,local_70) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._current._path._M_dataplus._M_p != &local_60._current._path.field_2) {
      operator_delete(local_60._current._path._M_dataplus._M_p,
                      local_60._current._path.field_2._M_allocated_capacity + 1);
    }
    if (1 < lVar3 + 1U) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::extension() const
{
    if (has_relative_path()) {
        auto iter = end();
        const auto& fn = *--iter;
        impl_string_type::size_type pos = fn._path.rfind('.');
        if (pos != std::string::npos && pos > 0) {
            return path(fn._path.substr(pos), native_format);
        }
    }
    return path();
}